

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theme.c
# Opt level: O3

natwm_error color_value_from_string(char *string,color_value **result)

{
  color_value *__ptr;
  size_t sVar1;
  ulong uVar2;
  char *fmt;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 uVar3;
  char *local_30;
  
  uVar3 = 0x104605;
  __ptr = (color_value *)malloc(0x10);
  if (__ptr == (color_value *)0x0) {
    return MEMORY_ALLOCATION_ERROR;
  }
  __ptr->string = string;
  if (*string == '#') {
    sVar1 = strlen(string);
    if (sVar1 != 7) {
      internal_logger(natwm_logger,LEVEL_ERROR,"Found a color value with an invalid length");
      goto LAB_001046a5;
    }
    local_30 = (char *)0x0;
    uVar2 = strtoul(string + 1,&local_30,0x10);
    if (local_30 != (char *)0x0) {
      __ptr->color_value = (uint32_t)uVar2;
      *result = __ptr;
      return NO_ERROR;
    }
    fmt = "Found an invalid color value: \'%s\'";
  }
  else {
    fmt = "Missing \'#\' in color value \'%s\'";
  }
  internal_logger(natwm_logger,LEVEL_ERROR,fmt,string,in_R8,in_R9,uVar3);
LAB_001046a5:
  free(__ptr);
  return INVALID_INPUT_ERROR;
}

Assistant:

enum natwm_error color_value_from_string(const char *string, struct color_value **result)
{
        struct color_value *value = malloc(sizeof(struct color_value));

        if (value == NULL) {
                return MEMORY_ALLOCATION_ERROR;
        }

        value->string = string;
        value->color_value = 0;

        if (string_to_rgb(string, &value->color_value) != NO_ERROR) {
                free(value);

                return INVALID_INPUT_ERROR;
        }

        *result = value;

        return NO_ERROR;
}